

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O1

bool mkvmuxer::WriteEbmlElement(IMkvWriter *writer,uint64 type,uint64 value,uint64 fixed_size)

{
  bool bVar1;
  int32 iVar2;
  uint64 value_00;
  
  if (writer == (IMkvWriter *)0x0) {
    return false;
  }
  iVar2 = WriteID(writer,type);
  if (iVar2 == 0) {
    value_00 = 1;
    if (((((0xff < value) && (value_00 = 2, 0xffff < value)) && (value_00 = 3, 0xffffff < value)) &&
        ((value_00 = 4, value >> 0x20 != 0 && (value_00 = 5, value >> 0x28 != 0)))) &&
       (value_00 = 6, value >> 0x30 != 0)) {
      value_00 = 8 - (ulong)(value >> 0x38 == 0);
    }
    if (((fixed_size == 0) || (bVar1 = value_00 <= fixed_size, value_00 = fixed_size, bVar1)) &&
       (iVar2 = WriteUInt(writer,value_00), iVar2 == 0)) {
      iVar2 = SerializeInt(writer,value,(int32)value_00);
      return iVar2 == 0;
    }
  }
  return false;
}

Assistant:

bool WriteEbmlElement(IMkvWriter* writer, uint64 type, uint64 value,
                      uint64 fixed_size) {
  if (!writer)
    return false;

  if (WriteID(writer, type))
    return false;

  uint64 size = GetUIntSize(value);
  if (fixed_size > 0) {
    if (size > fixed_size)
      return false;
    size = fixed_size;
  }
  if (WriteUInt(writer, size))
    return false;

  if (SerializeInt(writer, value, static_cast<int32>(size)))
    return false;

  return true;
}